

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

void __thiscall QSettings::endArray(QSettings *this)

{
  QObjectData *pQVar1;
  int *piVar2;
  ulong uVar3;
  iterator iVar4;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  long in_FS_OFFSET;
  wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> local_f8;
  QStringBuilder<QString,_QLatin1String> local_d8;
  QAnyStringView local_b0;
  value_type local_a0;
  QSettingsGroup local_78;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].children.d.ptr == (QObject **)0x0) {
    endArray();
  }
  else {
    local_78.str.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.str.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.str.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.num = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.maxNum = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    iVar4 = QList<QSettingsGroup>::end((QList<QSettingsGroup> *)&pQVar1[2].parent);
    local_78.str.d.d = iVar4.i[-1].str.d.d;
    local_78.str.d.ptr = iVar4.i[-1].str.d.ptr;
    local_78.str.d.size = iVar4.i[-1].str.d.size;
    if (&(local_78.str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.num = iVar4.i[-1].num;
    local_78.maxNum = iVar4.i[-1].maxNum;
    QSettingsGroup::toString(&local_d8.a,&local_78);
    piVar2 = (int *)CONCAT44(local_d8.a.d.d._4_4_,local_d8.a.d.d._0_4_);
    uVar3 = CONCAT44(local_d8.a.d.size._4_4_,(undefined4)local_d8.a.d.size);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_d8.a.d.d._4_4_,local_d8.a.d.d._0_4_),2,0x10);
      }
    }
    QList<QSettingsGroup>::takeLast(&local_a0,(QList<QSettingsGroup> *)&pQVar1[2].parent);
    __length = extraout_RDX;
    if (&(local_a0.str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.str.d.d)->super_QArrayData,2,0x10);
        __length = extraout_RDX_00;
      }
    }
    if (uVar3 != 0) {
      QString::truncate((QString *)&pQVar1[2].children.d.size,
                        (char *)((long)&(pQVar1[2].metaObject)->_vptr_QDynamicMetaObjectData +
                                ~uVar3),__length);
    }
    if (local_78.maxNum != -1) {
      if (&(local_78.str.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_d8.a.d.d._0_4_ = SUB84(local_78.str.d.d,0);
      local_d8.a.d.d._4_4_ = (undefined4)((ulong)local_78.str.d.d >> 0x20);
      local_d8.a.d.ptr._0_4_ = SUB84(local_78.str.d.ptr,0);
      local_d8.a.d.ptr._4_4_ = (undefined4)((ulong)local_78.str.d.ptr >> 0x20);
      local_d8.a.d.size._0_4_ = (undefined4)local_78.str.d.size;
      local_d8.a.d.size._4_4_ = (undefined4)((ulong)local_78.str.d.size >> 0x20);
      local_d8.b.m_size = 5;
      local_d8.b.m_data = "/size";
      local_f8.d.d = (Data *)0x0;
      local_f8.d.ptr = (char16_t *)0x0;
      local_f8.d.size = 0;
      QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
                (&local_b0,&local_d8,&local_f8);
      ::QVariant::QVariant(&local_48,local_78.maxNum);
      setValue(this,local_b0,&local_48);
      ::QVariant::~QVariant(&local_48);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar2 = (int *)CONCAT44(local_d8.a.d.d._4_4_,local_d8.a.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_d8.a.d.d._4_4_,local_d8.a.d.d._0_4_),2,0x10);
        }
      }
    }
    if (local_78.num == -1) {
      local_d8.a.d.d._0_4_ = 2;
      local_d8.a.d.d._4_4_ = 0;
      local_d8.a.d.ptr._0_4_ = 0;
      local_d8.a.d.ptr._4_4_ = 0;
      local_d8.a.d.size._0_4_ = 0;
      local_d8.a.d.size._4_4_ = 0;
      local_d8.b.m_size = 0x4ca5a5;
      QMessageLogger::warning
                ((QMessageLogger *)&local_d8,"QSettings::endArray: Expected endGroup() instead");
    }
    if (&(local_78.str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.str.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::endArray()
{
    Q_D(QSettings);
    if (d->groupStack.isEmpty()) {
        qWarning("QSettings::endArray: No matching beginArray()");
        return;
    }

    QSettingsGroup group = d->groupStack.top();
    qsizetype len = group.toString().size();
    d->groupStack.pop();
    if (len > 0)
        d->groupPrefix.truncate(d->groupPrefix.size() - (len + 1));

    if (group.arraySizeGuess() != -1)
        setValue(group.name() + "/size"_L1, group.arraySizeGuess());

    if (!group.isArray())
        qWarning("QSettings::endArray: Expected endGroup() instead");
}